

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase207::run(TestCase207 *this)

{
  _func_int ***ppp_Var1;
  _func_int ***ppp_Var2;
  Disposer *pDVar3;
  PromiseNode *pPVar4;
  undefined8 uVar5;
  TransformPromiseNodeBase *pTVar6;
  int iVar7;
  Own<kj::_::ChainPromiseNode> OVar8;
  WaitScope waitScope;
  EventLoop loop;
  Own<kj::_::PromiseNode> local_228;
  Own<kj::_::PromiseNode> local_218;
  Own<kj::_::PromiseNode> local_208;
  WaitScope local_1f8;
  uint local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  EventLoop local_1d0;
  ExceptionOrValue local_198;
  char local_38;
  
  EventLoop::EventLoop(&local_1d0);
  local_1f8.busyPollInterval = 0xffffffff;
  local_1f8.loop = &local_1d0;
  EventLoop::enterScope(&local_1d0);
  local_228.disposer = (Disposer *)0x0;
  local_228.ptr = (PromiseNode *)0x0;
  _::yield();
  pTVar6 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar6,(Own<kj::_::PromiseNode> *)&local_198,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:212:23),_kj::_::PropagateException>
             ::anon_class_8_1_70ebebfb_for_func::operator());
  uVar5 = local_198.exception.ptr.field_1.value.ownFile.content.ptr;
  (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00434a78;
  pTVar6[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&local_228;
  if ((PromiseNode *)local_198.exception.ptr.field_1.value.ownFile.content.ptr != (PromiseNode *)0x0
     ) {
    local_198.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_198.exception.ptr._4_4_,local_198.exception.ptr._0_4_)
    )((undefined8 *)CONCAT44(local_198.exception.ptr._4_4_,local_198.exception.ptr._0_4_),
      (char *)(uVar5 + (long)(*(_func_int ***)uVar5)[-2]));
  }
  pDVar3 = local_228.disposer;
  local_228.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase207::run()::$_0,kj::_::PropagateException>>
        ::instance;
  if (local_228.ptr != (PromiseNode *)0x0) {
    ppp_Var1 = &(local_228.ptr)->_vptr_PromiseNode;
    ppp_Var2 = &(local_228.ptr)->_vptr_PromiseNode;
    local_228.ptr = (PromiseNode *)pTVar6;
    (**pDVar3->_vptr_Disposer)(pDVar3,(*ppp_Var1)[-2] + (long)ppp_Var2);
    pTVar6 = (TransformPromiseNodeBase *)local_228.ptr;
  }
  local_228.ptr = &pTVar6->super_PromiseNode;
  iVar7 = 1000;
  do {
    pPVar4 = local_228.ptr;
    pDVar3 = local_228.disposer;
    local_228.ptr = (PromiseNode *)0x0;
    _::yield();
    pTVar6 = (TransformPromiseNodeBase *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,&local_208,
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:226:44),_kj::Promise<void>_>
               ::operator()<>);
    (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00434b00;
    pTVar6[1].dependency.disposer = pDVar3;
    pTVar6[1].dependency.ptr = pPVar4;
    local_218.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::CaptureByMove<kj::(anonymous_namespace)::TestCase207::run()::$_1,kj::Promise<void>>,kj::_::PropagateException>>
          ::instance;
    local_218.ptr = (PromiseNode *)pTVar6;
    OVar8 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_198,&local_218);
    pPVar4 = local_218.ptr;
    local_1e8 = local_198.exception.ptr._0_4_;
    uStack_1e4 = local_198.exception.ptr._4_4_;
    uStack_1e0 = local_198.exception.ptr.field_1._0_4_;
    uStack_1dc = local_198.exception.ptr.field_1._4_4_;
    if ((TransformPromiseNodeBase *)local_218.ptr != (TransformPromiseNodeBase *)0x0) {
      local_218.ptr = (PromiseNode *)0x0;
      (**(local_218.disposer)->_vptr_Disposer)
                (local_218.disposer,
                 ((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode,OVar8.ptr);
    }
    pPVar4 = local_208.ptr;
    if (local_208.ptr != (PromiseNode *)0x0) {
      local_208.ptr = (PromiseNode *)0x0;
      (**(local_208.disposer)->_vptr_Disposer)
                (local_208.disposer,pPVar4->_vptr_PromiseNode[-2] + (long)&pPVar4->_vptr_PromiseNode
                );
    }
    pPVar4 = local_228.ptr;
    pDVar3 = local_228.disposer;
    local_228.disposer = (Disposer *)CONCAT44(uStack_1e4,local_1e8);
    local_228.ptr = (PromiseNode *)CONCAT44(uStack_1dc,uStack_1e0);
    if (pPVar4 != (PromiseNode *)0x0) {
      (**pDVar3->_vptr_Disposer)
                (pDVar3,pPVar4->_vptr_PromiseNode[-2] + (long)&pPVar4->_vptr_PromiseNode);
    }
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  local_198.exception.ptr._0_4_ = local_198.exception.ptr._0_4_ & 0xffffff00;
  local_38 = '\0';
  _::waitImpl(&local_228,&local_198,&local_1f8);
  if (local_38 == '\x01') {
    if ((kj)local_198.exception.ptr.isSet != (kj)0x0) {
      throwRecoverableException(&local_198.exception.ptr.field_1.value,0);
    }
  }
  else {
    if ((kj)local_198.exception.ptr.isSet == (kj)0x0) {
      _::unreachable();
    }
    throwRecoverableException(&local_198.exception.ptr.field_1.value,0);
  }
  if ((kj)local_198.exception.ptr.isSet == (kj)0x1) {
    Exception::~Exception(&local_198.exception.ptr.field_1.value);
  }
  pPVar4 = local_228.ptr;
  if ((TransformPromiseNodeBase *)local_228.ptr != (TransformPromiseNodeBase *)0x0) {
    local_228.ptr = (PromiseNode *)0x0;
    (**(local_228.disposer)->_vptr_Disposer)
              (local_228.disposer,
               ((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar4->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  EventLoop::leaveScope(local_1f8.loop);
  EventLoop::~EventLoop(&local_1d0);
  return;
}

Assistant:

TEST(Async, DeepChain2) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = nullptr;
  promise = evalLater([&]() {
    auto trace = promise.trace();
    uint lines = 0;
    for (char c: trace) {
      lines += c == '\n';
    }

    // Chain nodes should have been collapsed such that instead of a chain of 1000 nodes, we have
    // 2-ish nodes.  We'll give a little room for implementation freedom.
    EXPECT_LT(lines, 5);
  });

  // Create a ridiculous chain of promises.
  for (uint i = 0; i < 1000; i++) {
    promise = evalLater(mvCapture(promise, [](Promise<void> promise) {
      return kj::mv(promise);
    }));
  }

  promise.wait(waitScope);
}